

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O1

int CreatePlaySoundFunc(VMFunctionBuilder *buildit,int value1,int value2)

{
  uint opc;
  uint opc_00;
  double val;
  
  opc = VMFunctionBuilder::GetConstantFloat(buildit,1.0);
  val = 1.0;
  if (value2 != 0) {
    val = 0.0;
  }
  opc_00 = VMFunctionBuilder::GetConstantFloat(buildit,val);
  VMFunctionBuilder::EmitParamInt(buildit,SoundMap.Array[(long)value1 + -1].ID);
  VMFunctionBuilder::Emit(buildit,0x47,4);
  VMFunctionBuilder::Emit(buildit,0x46,0,5,opc);
  VMFunctionBuilder::Emit(buildit,0x47,0);
  VMFunctionBuilder::Emit(buildit,0x46,0,5,opc_00);
  return 5;
}

Assistant:

static int CreatePlaySoundFunc(VMFunctionBuilder &buildit, int value1, int value2)
{ // A_PlaySound
	int float1 = buildit.GetConstantFloat(1);
	int attenreg = buildit.GetConstantFloat(value2 ? ATTN_NONE : ATTN_NORM);

	buildit.EmitParamInt(SoundMap[value1-1]);						// soundid
	buildit.Emit(OP_PARAMI, CHAN_BODY);								// channel
	buildit.Emit(OP_PARAM, 0, REGT_FLOAT | REGT_KONST, float1);		// volume
	buildit.Emit(OP_PARAMI, false);									// looping
	buildit.Emit(OP_PARAM, 0, REGT_FLOAT | REGT_KONST, attenreg);	// attenuation
	return 5;
}